

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_rvi.inc.c
# Opt level: O0

_Bool trans_srliw(DisasContext_conflict12 *ctx,arg_srliw *a)

{
  TCGContext_conflict11 *tcg_ctx_00;
  TCGv_i64 t_00;
  TCGv_i64 t;
  TCGContext_conflict11 *tcg_ctx;
  arg_srliw *a_local;
  DisasContext_conflict12 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  t_00 = tcg_temp_new_i64(tcg_ctx_00);
  gen_get_gpr(tcg_ctx_00,t_00,a->rs1);
  tcg_gen_extract_i64_riscv64(tcg_ctx_00,t_00,t_00,a->shamt,0x20 - a->shamt);
  tcg_gen_ext32s_i64_riscv64(tcg_ctx_00,t_00,t_00);
  gen_set_gpr(tcg_ctx_00,a->rd,t_00);
  tcg_temp_free_i64(tcg_ctx_00,t_00);
  return true;
}

Assistant:

static bool trans_srliw(DisasContext *ctx, arg_srliw *a)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t = tcg_temp_new(tcg_ctx);
    gen_get_gpr(tcg_ctx, t, a->rs1);
    tcg_gen_extract_tl(tcg_ctx, t, t, a->shamt, 32 - a->shamt);
    /* sign-extend for W instructions */
    tcg_gen_ext32s_tl(tcg_ctx, t, t);
    gen_set_gpr(tcg_ctx, a->rd, t);
    tcg_temp_free(tcg_ctx, t);
    return true;
}